

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O0

int __thiscall Fl_Button::value(Fl_Button *this,int v)

{
  Fl_Boxtype FVar1;
  bool bVar2;
  int v_local;
  Fl_Button *this_local;
  
  bVar2 = v != 0;
  this->oldval = bVar2;
  Fl_Widget::clear_changed(&this->super_Fl_Widget);
  if ((int)this->value_ == (uint)bVar2) {
    this_local._4_4_ = 0;
  }
  else {
    this->value_ = bVar2;
    FVar1 = Fl_Widget::box(&this->super_Fl_Widget);
    if (FVar1 == FL_NO_BOX) {
      Fl_Widget::redraw_label(&this->super_Fl_Widget);
    }
    else {
      Fl_Widget::redraw(&this->super_Fl_Widget);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Button::value(int v) {
  v = v ? 1 : 0;
  oldval = v;
  clear_changed();
  if (value_ != v) {
    value_ = v;
    if (box()) redraw();
    else redraw_label();
    return 1;
  } else {
    return 0;
  }
}